

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O0

void __thiscall
glslang::TParseContext::addQualifierToExisting
          (TParseContext *this,TSourceLoc *loc,TQualifier qualifier,TString *identifier)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  TVariable *this_00;
  char *pcVar4;
  undefined4 extraout_var;
  long *plVar5;
  long lVar6;
  TQualifier *pTVar7;
  size_t s;
  TVariable *blockNameVar;
  TType blockNameType;
  TType blockType;
  TTypeList typeList;
  TSymbol *symbol;
  TString *identifier_local;
  TSourceLoc *loc_local;
  TParseContext *this_local;
  
  typeList.super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
  super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)TSymbolTable::find((this->super_TParseContextBase).symbolTable,identifier,
                                   (bool *)0x0,(bool *)0x0,(int *)0x0);
  if (((TSymbol *)
       typeList.super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
       super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage == (TSymbol *)0x0) &&
     (bVar1 = TQualifier::hasBufferReference(&qualifier), bVar1)) {
    bVar1 = TQualifier::hasBufferReferenceAlign(&qualifier);
    if (bVar1) {
      pcVar4 = std::__cxx11::
               basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                         (identifier);
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2e])
                (this,loc,
                 "the buffer_reference_align layout is ignored when defined in forward declaration",
                 pcVar4,"");
    }
    bVar1 = TQualifier::hasPacking(&qualifier);
    if (bVar1) {
      pcVar4 = std::__cxx11::
               basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                         (identifier);
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2e])
                (this,loc,
                 "the packing layout (scalar, std430, etc) is ignored when defined in forward declaration"
                 ,pcVar4,"");
    }
    TVector<glslang::TTypeLoc>::TVector((TVector<glslang::TTypeLoc> *)&blockType.spirvType);
    TType::TType((TType *)&blockNameType.spirvType,(TTypeList *)&blockType.spirvType,identifier,
                 &qualifier);
    s = 0x12;
    TType::TType((TType *)&blockNameVar,EbtReference,(TType *)&blockNameType.spirvType,identifier);
    this_00 = (TVariable *)TSymbol::operator_new((TSymbol *)0xf8,s);
    TVariable::TVariable(this_00,identifier,(TType *)&blockNameVar,true);
    bVar1 = TSymbolTable::insert((this->super_TParseContextBase).symbolTable,(TSymbol *)this_00);
    if (!bVar1) {
      pcVar4 = std::__cxx11::
               basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                         (this->blockName);
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"block name cannot redefine a non-block name",pcVar4,"");
    }
    TType::~TType((TType *)&blockNameVar);
    TType::~TType((TType *)&blockNameType.spirvType);
    TVector<glslang::TTypeLoc>::~TVector((TVector<glslang::TTypeLoc> *)&blockType.spirvType);
  }
  else if ((TSymbol *)
           typeList.super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
           super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage == (TSymbol *)0x0) {
    pcVar4 = std::__cxx11::
             basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                       (identifier);
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"identifier not previously declared",pcVar4,"");
  }
  else {
    iVar2 = (*((TSymbol *)
              typeList.super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
              super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage)->_vptr_TSymbol[7])();
    if (CONCAT44(extraout_var,iVar2) == 0) {
      bVar1 = TQualifier::isAuxiliary(&qualifier);
      if ((((bVar1) || (bVar1 = TQualifier::isMemory(&qualifier), bVar1)) ||
          (bVar1 = TQualifier::isInterpolation(&qualifier), bVar1)) ||
         (((bVar1 = TQualifier::hasLayout(&qualifier), bVar1 ||
           (((undefined1  [80])qualifier & (undefined1  [80])0x7f) != (undefined1  [80])0x0)) ||
          (((ulong)qualifier._8_8_ >> 0x19 & 7) != 0)))) {
        pcVar4 = std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                           (identifier);
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,
                   "cannot add storage, auxiliary, memory, interpolation, layout, or precision qualifier to an existing variable"
                   ,pcVar4,"");
      }
      else {
        uVar3 = (*((TSymbol *)
                  typeList.
                  super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
                  super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage)->_vptr_TSymbol[0x14])();
        if ((uVar3 & 1) != 0) {
          typeList.super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
          super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>._M_impl
          .super__Vector_impl_data._M_end_of_storage =
               (pointer)TSymbolTable::copyUp
                                  ((this->super_TParseContextBase).symbolTable,
                                   (TSymbol *)
                                   typeList.
                                   super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                   .
                                   super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        if (((ulong)qualifier._8_8_ >> 0x1c & 1) == 0) {
          bVar1 = TQualifier::isNoContraction(&qualifier);
          if (bVar1) {
            bVar1 = TIntermediate::inIoAccessed
                              ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                               identifier);
            if (bVar1) {
              (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                        (this,loc,"cannot change qualification after use","precise","");
            }
            plVar5 = (long *)(*(code *)(typeList.
                                        super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                        .
                                        super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage)->type->
                                       field_13)();
            pTVar7 = (TQualifier *)(**(code **)(*plVar5 + 0x50))();
            TQualifier::setNoContraction(pTVar7);
          }
          else if (((ulong)qualifier._8_8_ >> 0x20 & 1) == 0) {
            (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2e])
                      (this,loc,"unknown requalification","");
          }
          else {
            plVar5 = (long *)(*(code *)(typeList.
                                        super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                        .
                                        super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage)->type->
                                       field_13)();
            pTVar7 = (TQualifier *)(**(code **)(*plVar5 + 0x50))();
            TQualifier::makeSpecConstant(pTVar7);
            bVar1 = TQualifier::hasSpecConstantId(&qualifier);
            if (bVar1) {
              uVar3 = qualifier._40_4_;
              plVar5 = (long *)(*(code *)(typeList.
                                          super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                          .
                                          super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage)->type
                                         ->field_13)();
              lVar6 = (**(code **)(*plVar5 + 0x50))();
              *(ulong *)(lVar6 + 0x24) =
                   *(ulong *)(lVar6 + 0x24) & 0xfff800ffffffffff |
                   (ulong)(uVar3 >> 8 & 0x7ff) << 0x28;
            }
          }
        }
        else {
          bVar1 = TIntermediate::inIoAccessed
                            ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                             identifier);
          if (bVar1) {
            (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                      (this,loc,"cannot change qualification after use","invariant","");
          }
          plVar5 = (long *)(*(code *)(typeList.
                                      super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                      .
                                      super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage)->type->
                                     field_13)();
          lVar6 = (**(code **)(*plVar5 + 0x50))();
          *(ulong *)(lVar6 + 8) = *(ulong *)(lVar6 + 8) & 0xffffffffefffffff | 0x10000000;
          plVar5 = (long *)(*(code *)(typeList.
                                      super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                      .
                                      super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage)->type->
                                     arraySizes)();
          pTVar7 = (TQualifier *)(**(code **)(*plVar5 + 0x58))();
          invariantCheck(this,loc,pTVar7);
        }
      }
    }
    else {
      pcVar4 = std::__cxx11::
               basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                         (identifier);
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"cannot re-qualify a function name",pcVar4,"");
    }
  }
  return;
}

Assistant:

void TParseContext::addQualifierToExisting(const TSourceLoc& loc, TQualifier qualifier, const TString& identifier)
{
    TSymbol* symbol = symbolTable.find(identifier);

    // A forward declaration of a block reference looks to the grammar like adding
    // a qualifier to an existing symbol. Detect this and create the block reference
    // type with an empty type list, which will be filled in later in
    // TParseContext::declareBlock.
    if (!symbol && qualifier.hasBufferReference()) {
        // The layout qualifiers are ignored in forward declaration, give warning for the most probable to be seen
        if (qualifier.hasBufferReferenceAlign()) {
            warn(loc, "the buffer_reference_align layout is ignored when defined in forward declaration",
                 identifier.c_str(), "");
        }
        if (qualifier.hasPacking()) {
            warn(loc, "the packing layout (scalar, std430, etc) is ignored when defined in forward declaration",
                 identifier.c_str(), "");
        }
        TTypeList typeList;
        TType blockType(&typeList, identifier, qualifier);
        TType blockNameType(EbtReference, blockType, identifier);
        TVariable* blockNameVar = new TVariable(&identifier, blockNameType, true);
        if (! symbolTable.insert(*blockNameVar)) {
            error(loc, "block name cannot redefine a non-block name", blockName->c_str(), "");
        }
        return;
    }

    if (! symbol) {
        error(loc, "identifier not previously declared", identifier.c_str(), "");
        return;
    }
    if (symbol->getAsFunction()) {
        error(loc, "cannot re-qualify a function name", identifier.c_str(), "");
        return;
    }

    if (qualifier.isAuxiliary() ||
        qualifier.isMemory() ||
        qualifier.isInterpolation() ||
        qualifier.hasLayout() ||
        qualifier.storage != EvqTemporary ||
        qualifier.precision != EpqNone) {
        error(loc, "cannot add storage, auxiliary, memory, interpolation, layout, or precision qualifier to an existing variable", identifier.c_str(), "");
        return;
    }

    // For read-only built-ins, add a new symbol for holding the modified qualifier.
    // This will bring up an entire block, if a block type has to be modified (e.g., gl_Position inside a block)
    if (symbol->isReadOnly())
        symbol = symbolTable.copyUp(symbol);

    if (qualifier.invariant) {
        if (intermediate.inIoAccessed(identifier))
            error(loc, "cannot change qualification after use", "invariant", "");
        symbol->getWritableType().getQualifier().invariant = true;
        invariantCheck(loc, symbol->getType().getQualifier());
    } else if (qualifier.isNoContraction()) {
        if (intermediate.inIoAccessed(identifier))
            error(loc, "cannot change qualification after use", "precise", "");
        symbol->getWritableType().getQualifier().setNoContraction();
    } else if (qualifier.specConstant) {
        symbol->getWritableType().getQualifier().makeSpecConstant();
        if (qualifier.hasSpecConstantId())
            symbol->getWritableType().getQualifier().layoutSpecConstantId = qualifier.layoutSpecConstantId;
    } else
        warn(loc, "unknown requalification", "", "");
}